

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::RepeatedField
          (RepeatedField<unsigned_int> *this,RepeatedField<unsigned_int> *other)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void **ppvVar6;
  
  this->current_size_ = 0;
  this->total_size_ = 0;
  this->arena_or_elements_ = (void *)0x0;
  ppvVar6 = (void **)((long)other->arena_or_elements_ + -8);
  if (other->total_size_ == 0) {
    ppvVar6 = &other->arena_or_elements_;
  }
  if (*ppvVar6 == (void *)0x0) {
    iVar4 = this->current_size_;
    iVar5 = this->total_size_;
    pvVar1 = this->arena_or_elements_;
    iVar3 = other->total_size_;
    pvVar2 = other->arena_or_elements_;
    this->current_size_ = other->current_size_;
    this->total_size_ = iVar3;
    this->arena_or_elements_ = pvVar2;
    other->current_size_ = iVar4;
    other->total_size_ = iVar5;
    other->arena_or_elements_ = pvVar1;
  }
  else if (other != this) {
    this->current_size_ = 0;
    if (other->current_size_ != 0) {
      Reserve(this,other->current_size_);
      this->current_size_ = this->current_size_ + other->current_size_;
      memcpy(this->arena_or_elements_,other->arena_or_elements_,(long)other->current_size_ << 2);
      return;
    }
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(RepeatedField&& other) noexcept
    : RepeatedField() {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // other is on an arena. This field can't be on an arena because arena
  // construction always uses the Arena* accepting constructor.
  if (other.GetArena()) {
    CopyFrom(other);
  } else {
    InternalSwap(&other);
  }
}